

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::TextureSamplerTest::iterate(TextureSamplerTest *this)

{
  bool bVar1;
  int iVar2;
  TestLog *log_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RGBA local_a4;
  RGBA local_a0;
  byte local_99;
  int local_98;
  int iStack_94;
  bool isOk;
  int y;
  int x;
  Surface samplerResult;
  Surface textureResult;
  undefined1 local_50 [8];
  Surface samplerRef;
  Surface textureRef;
  TestLog *log;
  TextureSamplerTest *this_local;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  tcu::Surface::Surface((Surface *)&samplerRef.m_pixels.m_cap,0x80,0x80);
  tcu::Surface::Surface((Surface *)local_50,0x80,0x80);
  tcu::Surface::Surface((Surface *)&samplerResult.m_pixels.m_cap,0x80,0x80);
  tcu::Surface::Surface((Surface *)&y,0x80,0x80);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar2));
  iStack_94 = de::Random::getInt(&this->m_random,0,iVar2 + -0x80);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar2));
  local_98 = de::Random::getInt(&this->m_random,0,iVar2 + -0x80);
  renderReferences(this,(Surface *)&samplerRef.m_pixels.m_cap,(Surface *)local_50,iStack_94,local_98
                  );
  renderResults(this,(Surface *)&samplerResult.m_pixels.m_cap,(Surface *)&y,iStack_94,local_98);
  tcu::RGBA::RGBA(&local_a0,0,0,0,0);
  local_99 = tcu::pixelThresholdCompare
                       (log_00,"Sampler render result","Result from rendering with sampler",
                        (Surface *)local_50,(Surface *)&y,&local_a0,COMPARE_LOG_RESULT);
  tcu::RGBA::RGBA(&local_a4,0,0,0,0);
  bVar1 = tcu::pixelThresholdCompare
                    (log_00,"Texture render result","Result from rendering with texture state",
                     (Surface *)&samplerRef.m_pixels.m_cap,(Surface *)&samplerResult.m_pixels.m_cap,
                     &local_a4,COMPARE_LOG_RESULT);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_99 = 0;
  }
  if ((local_99 & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  tcu::Surface::~Surface((Surface *)&y);
  tcu::Surface::~Surface((Surface *)&samplerResult.m_pixels.m_cap);
  tcu::Surface::~Surface((Surface *)local_50);
  tcu::Surface::~Surface((Surface *)&samplerRef.m_pixels.m_cap);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult TextureSamplerTest::iterate (void)
{
	tcu::TestLog&	log = m_testCtx.getLog();

	tcu::Surface	textureRef(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	tcu::Surface	samplerRef(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);

	tcu::Surface	textureResult(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	tcu::Surface	samplerResult(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);

	int				x = m_random.getInt(0, m_renderCtx.getRenderTarget().getWidth() - VIEWPORT_WIDTH);
	int				y = m_random.getInt(0, m_renderCtx.getRenderTarget().getHeight() - VIEWPORT_HEIGHT);

	renderReferences(textureRef, samplerRef, x, y);
	renderResults(textureResult, samplerResult, x, y);

	bool isOk = pixelThresholdCompare (log, "Sampler render result", "Result from rendering with sampler", samplerRef, samplerResult, tcu::RGBA(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT);

	if (!pixelThresholdCompare (log, "Texture render result", "Result from rendering with texture state", textureRef, textureResult, tcu::RGBA(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT))
		isOk = false;

	if (!isOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}